

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall bloom_tests::merkle_block_2::test_method(merkle_block_2 *this)

{
  long lVar1;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  bool bVar2;
  reference __src;
  size_type sVar3;
  unit_test_log_t *this_00;
  unit_test_log_t *puVar4;
  long in_FS_OFFSET;
  CMerkleBlock *in_stack_ffffffffffffeaa8;
  undefined7 in_stack_ffffffffffffeab0;
  undefined1 in_stack_ffffffffffffeab7;
  CMerkleBlock *in_stack_ffffffffffffeab8;
  undefined7 in_stack_ffffffffffffeac0;
  undefined1 in_stack_ffffffffffffeac7;
  CBlock *in_stack_ffffffffffffeac8;
  const_string *in_stack_ffffffffffffead0;
  undefined7 in_stack_ffffffffffffead8;
  undefined1 in_stack_ffffffffffffeadf;
  const_string *in_stack_ffffffffffffeae0;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffeae8;
  undefined4 in_stack_ffffffffffffeaf0;
  uint in_stack_ffffffffffffeaf4;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffeaf8;
  CPartialMerkleTree *in_stack_ffffffffffffeb00;
  CBloomFilter *in_stack_ffffffffffffeb08;
  uint i_1;
  uint i;
  merkle_block_2 *this_local;
  const_string local_12c0 [2];
  lazy_ostream local_12a0 [2];
  assertion_result local_1280 [2];
  const_string local_1248 [2];
  lazy_ostream local_1228 [2];
  assertion_result local_1208 [2];
  const_string local_11d0 [2];
  lazy_ostream local_11b0 [2];
  assertion_result local_1190 [2];
  const_string local_1158 [2];
  lazy_ostream local_1138 [2];
  assertion_result local_1118 [2];
  const_string local_10e0 [2];
  lazy_ostream local_10c0 [2];
  assertion_result local_10a0 [2];
  const_string local_1068 [2];
  lazy_ostream local_1048 [2];
  assertion_result local_1028;
  undefined8 local_1000;
  const_string local_ff0 [2];
  lazy_ostream local_fd0 [2];
  assertion_result local_fb0 [2];
  const_string local_f78 [2];
  lazy_ostream local_f58 [2];
  assertion_result local_f38 [2];
  const_string local_f00 [2];
  lazy_ostream local_ee0 [2];
  assertion_result local_ec0 [2];
  const_string local_e88 [2];
  lazy_ostream local_e68 [2];
  assertion_result local_e48 [2];
  const_string local_e10 [2];
  lazy_ostream local_df0 [2];
  assertion_result local_dd0 [2];
  const_string local_d98 [2];
  lazy_ostream local_d78 [2];
  assertion_result local_d58 [3];
  const_string local_d10 [2];
  lazy_ostream local_cf0 [2];
  assertion_result local_cd0 [2];
  const_string local_c98 [2];
  lazy_ostream local_c78 [2];
  assertion_result local_c58 [2];
  const_string local_c20 [2];
  lazy_ostream local_c00 [2];
  assertion_result local_be0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  const_string local_b78 [2];
  lazy_ostream local_b58 [2];
  assertion_result local_b38 [2];
  const_string local_b00 [2];
  lazy_ostream local_ae0 [2];
  assertion_result local_ac0 [2];
  const_string local_a88 [2];
  lazy_ostream local_a68 [2];
  assertion_result local_a48 [2];
  const_string local_a10 [2];
  lazy_ostream local_9f0 [2];
  assertion_result local_9d0 [3];
  ParamsWrapper<TransactionSerParams,_CBlock> local_988;
  DataStream stream;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_ffffffffffffeac8);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<2771UL>___1,_0,_0,_0,_117,_97,_98,_54,_204,_33,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,1385ul>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffeab8,
             (array<std::byte,_1385UL> *)
             CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),in_stack_ffffffffffffeaa8
            );
  sp.m_size._0_7_ = in_stack_ffffffffffffead8;
  sp.m_data = (byte *)in_stack_ffffffffffffead0;
  sp.m_size._7_1_ = in_stack_ffffffffffffeadf;
  DataStream::DataStream
            ((DataStream *)CONCAT17(in_stack_ffffffffffffeac7,in_stack_ffffffffffffeac0),sp);
  local_988 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_ffffffffffffeab8,
                         (CBlock *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffeab8,
             (ParamsWrapper<TransactionSerParams,_CBlock> *)
             CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffeb08,(uint)((ulong)in_stack_ffffffffffffeb00 >> 0x20),
             (double)in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
             (uchar)((uint)in_stack_ffffffffffffeaf0 >> 0x18));
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffeab8,
             (uint256 *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
             in_stack_ffffffffffffeaa8);
  vKey.m_size._0_7_ = in_stack_ffffffffffffead8;
  vKey.m_data = (uchar *)in_stack_ffffffffffffead0;
  vKey.m_size._7_1_ = in_stack_ffffffffffffeadf;
  CBloomFilter::insert((CBloomFilter *)in_stack_ffffffffffffeab8,vKey);
  CMerkleBlock::CMerkleBlock
            (in_stack_ffffffffffffeab8,
             (CBlock *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
             (CBloomFilter *)in_stack_ffffffffffffeaa8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    CBlockHeader::GetHash(&in_stack_ffffffffffffeac8->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_ffffffffffffeac8->super_CBlockHeader);
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9d0,local_9f0,local_a10,0xe5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a48,local_a68,local_a88,0xe7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __src = std::
          vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          ::operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        *)in_stack_ffffffffffffeab8,
                       CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
  memcpy(&pair,__src,0x24);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ac0,local_ae0,local_b00,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b38,local_b58,local_b78,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeaa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeaa8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    CPartialMerkleTree::ExtractMatches
              (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffeaf4,in_stack_ffffffffffffeaf0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_be0,local_c00,local_c20,0xef,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeaa8);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c58,local_c78,local_c98,0xf0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  i = 0;
  while( true ) {
    sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeaa8);
    if (sVar3 <= i) break;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
                 CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
                 in_stack_ffffffffffffead0);
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeab8,
                 CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)in_stack_ffffffffffffeab8,
                 CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
      ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                   (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0))
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_cd0,local_cf0,local_d10,0xf2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffeaa8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeaa8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    i = i + 1;
  }
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<131UL>___4,_74,_101,_111,_6,_88,_113,_163,_83,_242,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,65ul>>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffeab8,
             (array<unsigned_char,_65UL> *)
             CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),in_stack_ffffffffffffeaa8
            );
  vKey_00.m_size._0_7_ = in_stack_ffffffffffffead8;
  vKey_00.m_data = (uchar *)in_stack_ffffffffffffead0;
  vKey_00.m_size._7_1_ = in_stack_ffffffffffffeadf;
  CBloomFilter::insert((CBloomFilter *)in_stack_ffffffffffffeab8,vKey_00);
  CMerkleBlock::CMerkleBlock
            (in_stack_ffffffffffffeab8,
             (CBlock *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
             (CBloomFilter *)in_stack_ffffffffffffeaa8);
  CMerkleBlock::operator=
            (in_stack_ffffffffffffeab8,
             (CMerkleBlock *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
  CMerkleBlock::~CMerkleBlock(in_stack_ffffffffffffeaa8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    CBlockHeader::GetHash(&in_stack_ffffffffffffeac8->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_ffffffffffffeac8->super_CBlockHeader);
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d58,local_d78,local_d98,0xfa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_dd0,local_df0,local_e10,0xfc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    std::operator==((pair<unsigned_int,_uint256> *)in_stack_ffffffffffffeab8,
                    (pair<unsigned_int,_uint256> *)
                    CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e48,local_e68,local_e88,0xfe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ec0,local_ee0,local_f00,0x100,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f38,local_f58,local_f78,0x101,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fb0,local_fd0,local_ff0,0x103,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1028,local_1048,local_1068,0x104,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10a0,local_10c0,local_10e0,0x106,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)in_stack_ffffffffffffeab8,
               CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1118,local_1138,local_1158,0x107,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    CPartialMerkleTree::ExtractMatches
              (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffeaf4,in_stack_ffffffffffffeaf0));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1190,local_11b0,local_11d0,0x109,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,
               CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
               in_stack_ffffffffffffead0);
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeaa8);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
               (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
               (unsigned_long)in_stack_ffffffffffffeaa8);
    in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1208,local_1228,local_1248,0x10a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeaa8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeaa8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  i_1 = 0;
  while( true ) {
    this_00 = (unit_test_log_t *)(ulong)i_1;
    puVar4 = (unit_test_log_t *)
             std::vector<uint256,_std::allocator<uint256>_>::size
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeaa8);
    if (puVar4 <= this_00) break;
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,file,CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
                 in_stack_ffffffffffffead0);
      in_stack_ffffffffffffead0 =
           (const_string *)
           std::vector<uint256,_std::allocator<uint256>_>::operator[]
                     ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeab8,
                      CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)in_stack_ffffffffffffeab8,
                 CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
      in_stack_ffffffffffffeadf =
           ::operator==((base_blob<256U> *)in_stack_ffffffffffffeab8,
                        (base_blob<256U> *)
                        CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffeab8,(bool)in_stack_ffffffffffffeab7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffeaa8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeab8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeab7,in_stack_ffffffffffffeab0),
                 (unsigned_long)in_stack_ffffffffffffeaa8);
      in_stack_ffffffffffffeaa8 = (CMerkleBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1280,local_12a0,local_12c0,0x10c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffeaa8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeaa8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    i_1 = i_1 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeab8);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffeab8);
  CMerkleBlock::~CMerkleBlock(in_stack_ffffffffffffeaa8);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffeaa8);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffeaa8);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffeaa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_2)
{
    // Random real block (000000005a4ded781e667e06ceefafb71410b511fe0d5adc3e5a27ecbec34ae6)
    // With 4 txes
    CBlock block;
    DataStream stream{
        "0100000075616236cc2126035fadb38deb65b9102cc2c41c09cdf29fc051906800000000fe7d5e12ef0ff901f6050211249919b1c0653771832b3a80c66cea42847f0ae1d4d26e49ffff001d00f0a4410401000000010000000000000000000000000000000000000000000000000000000000000000ffffffff0804ffff001d029105ffffffff0100f2052a010000004341046d8709a041d34357697dfcb30a9d05900a6294078012bf3bb09c6f9b525f1d16d5503d7905db1ada9501446ea00728668fc5719aa80be2fdfc8a858a4dbdd4fbac00000000010000000255605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d28350000000049483045022100aa46504baa86df8a33b1192b1b9367b4d729dc41e389f2c04f3e5c7f0559aae702205e82253a54bf5c4f65b7428551554b2045167d6d206dfe6a2e198127d3f7df1501ffffffff55605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d2835010000004847304402202329484c35fa9d6bb32a55a70c0982f606ce0e3634b69006138683bcd12cbb6602200c28feb1e2555c3210f1dddb299738b4ff8bbe9667b68cb8764b5ac17b7adf0001ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac0000000001000000025f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028000000004847304402205d6058484157235b06028c30736c15613a28bdb768ee628094ca8b0030d4d6eb0220328789c9a2ec27ddaec0ad5ef58efded42e6ea17c2e1ce838f3d6913f5e95db601ffffffff5f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028010000004a493046022100c45af050d3cea806cedd0ab22520c53ebe63b987b8954146cdca42487b84bdd6022100b9b027716a6b59e640da50a864d6dd8a0ef24c76ce62391fa3eabaf4d2886d2d01ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac000000000100000002e2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b0000000048473044022016e7a727a061ea2254a6c358376aaa617ac537eb836c77d646ebda4c748aac8b0220192ce28bf9f2c06a6467e6531e27648d2b3e2e2bae85159c9242939840295ba501ffffffffe2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b010000004a493046022100b7a1a755588d4190118936e15cd217d133b0e4a53c3c15924010d5648d8925c9022100aaef031874db2114f2d869ac2de4ae53908fbfea5b2b1862e181626bb9005c9f01ffffffff0200e1f505000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the first transaction
    filter.insert(uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Match an output from the second transaction (the pubkey for address 1DZTzaBHUDM7T3QvUKBz4qXMRpkg8jsfB5)
    // This should match the third transaction because it spends the output matched
    // It also matches the fourth transaction, which spends to the pubkey again
    filter.insert("044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45af"_hex_u8);

    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 4);

    BOOST_CHECK(pair == merkleBlock.vMatchedTxn[0]);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1].second == uint256{"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[1].first == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[2].second == uint256{"6b0f8a73a56c04b519f1883e8aafda643ba61a30bd1439969df21bea5f4e27e2"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[2].first == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[3].second == uint256{"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[3].first == 3);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}